

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::DXFImporter::Parse3DFace(DXFImporter *this,LineReader *reader,FileData *output)

{
  pointer *ppuVar1;
  pointer *ppaVar2;
  pointer *ppaVar3;
  string *psVar4;
  pointer pBVar5;
  element_type *this_00;
  iterator __position;
  pointer psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  iterator __position_00;
  iterator __position_01;
  float fVar7;
  aiColor4D aVar8;
  byte bVar9;
  char *pcVar10;
  Logger *this_02;
  uint uVar11;
  char cVar12;
  aiVector3t<float> *__args;
  ulong uVar13;
  uint cnt;
  aiVector3D vip [4];
  aiColor4D clr;
  float local_cc;
  ulong local_c8;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  ulong local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  uint local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  FileData *local_50;
  aiColor4D local_48;
  string *local_38;
  
  pBVar5 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_88 = (PolyLine *)operator_new(0xa8);
  (local_88->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_88->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_88->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_88->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_88->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_88->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_88->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_88->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_88->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_88->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_88->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_88->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88->flags = 0;
  (local_88->layer)._M_dataplus._M_p = (pointer)&(local_88->layer).field_2;
  (local_88->layer)._M_string_length = 0;
  (local_88->layer).field_2._M_local_buf[0] = '\0';
  (local_88->desc)._M_dataplus._M_p = (pointer)&(local_88->desc).field_2;
  (local_88->desc)._M_string_length = 0;
  (local_88->desc).field_2._M_local_buf[0] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::DXF::PolyLine*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&uStack_80,local_88);
  __args = (aiVector3t<float> *)&local_88;
  std::
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>>>
  ::emplace_back<std::shared_ptr<Assimp::DXF::PolyLine>>
            ((vector<std::shared_ptr<Assimp::DXF::PolyLine>,std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>>>
              *)(pBVar5 + -1),(shared_ptr<Assimp::DXF::PolyLine> *)__args);
  if (uStack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_80);
  }
  this_00 = (output->blocks).
            super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].lines.
            super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88._0_4_ = 0.0;
  local_88._4_4_ = 0.0;
  uStack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = AI_DXF_DEFAULT_COLOR;
  if (reader->end < 2) {
    psVar4 = &reader->value;
    local_38 = (string *)&this_00->layer;
    local_bc = 0.0;
    local_98 = 0;
    local_c0 = 0.0;
    local_b4 = 0.0;
    local_b8 = 0.0;
    local_ac = 0.0;
    local_b0 = 0.0;
    local_a0 = 0;
    local_a8 = 0;
    local_c8 = 0;
    local_50 = output;
    do {
      switch(reader->groupcode) {
      case 0:
        goto switchD_004379d9_caseD_0;
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 9:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
        break;
      case 8:
        std::__cxx11::string::_M_assign(local_38);
        break;
      case 10:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        local_88._0_4_ = local_cc;
        goto LAB_00437bd0;
      case 0xb:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        uStack_80._4_4_ = local_cc;
        goto LAB_00437c32;
      case 0xc:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        local_ac = local_cc;
        uStack_70 = CONCAT44(uStack_70._4_4_,local_cc);
        goto LAB_00437c04;
      case 0xd:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        local_b0 = local_cc;
        local_68 = CONCAT44(local_cc,(undefined4)local_68);
        goto LAB_00437b48;
      case 0x14:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        local_88._4_4_ = local_cc;
        goto LAB_00437bd0;
      case 0x15:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        local_78 = CONCAT44(local_78._4_4_,local_cc);
        goto LAB_00437c32;
      case 0x16:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        local_b4 = local_cc;
        uStack_70 = CONCAT44(local_cc,(undefined4)uStack_70);
        goto LAB_00437c04;
      case 0x17:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        local_b8 = local_cc;
        uStack_60 = CONCAT44(uStack_60._4_4_,local_cc);
        goto LAB_00437b48;
      case 0x1e:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        uStack_80._0_4_ = local_cc;
LAB_00437bd0:
        local_a0 = CONCAT71((int7)((ulong)pcVar10 >> 8),1);
        break;
      case 0x1f:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        local_78 = CONCAT44(local_cc,(undefined4)local_78);
LAB_00437c32:
        local_98 = CONCAT71((int7)((ulong)pcVar10 >> 8),1);
        break;
      case 0x20:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        local_bc = local_cc;
        local_68 = CONCAT44(local_68._4_4_,local_cc);
LAB_00437c04:
        local_c8 = CONCAT71((int7)((ulong)pcVar10 >> 8),1);
        break;
      case 0x21:
        local_cc = 0.0;
        pcVar10 = fast_atoreal_move<float>((psVar4->_M_dataplus)._M_p,&local_cc,true);
        local_c0 = local_cc;
        uStack_60 = CONCAT44(local_cc,(undefined4)uStack_60);
LAB_00437b48:
        local_a8 = CONCAT71((int7)((ulong)pcVar10 >> 8),1);
        break;
      default:
        if (reader->groupcode == 0x3e) {
          pcVar10 = (psVar4->_M_dataplus)._M_p;
          cVar12 = *pcVar10;
          if ((byte)(cVar12 - 0x3aU) < 0xf6) {
            uVar11 = 0;
          }
          else {
            uVar11 = 0;
            do {
              pcVar10 = pcVar10 + 1;
              uVar11 = (uint)(byte)(cVar12 - 0x30) + uVar11 * 10;
              cVar12 = *pcVar10;
            } while (0xf5 < (byte)(cVar12 - 0x3aU));
            uVar11 = uVar11 & 0xf;
          }
          local_48 = *(aiColor4D *)((long)&g_aclrDxfIndexColors[0].r + (ulong)(uVar11 << 4));
        }
      }
      DXF::LineReader::operator++(reader);
    } while (reader->end < 2);
switchD_004379d9_caseD_0:
    output = local_50;
    if (((((local_b0 != local_ac) || (NAN(local_b0) || NAN(local_ac))) || (local_b8 != local_b4)) ||
        ((NAN(local_b8) || NAN(local_b4) || (local_c0 != local_bc)))) ||
       (NAN(local_c0) || NAN(local_bc))) {
      bVar9 = (byte)local_a8;
      if (((local_a8 & 1) != 0) && ((local_c8 & 1) == 0)) goto LAB_00437d10;
    }
    else {
      bVar9 = 0;
    }
    if (((byte)local_a0 & (byte)local_98 & 1) != 0) {
      local_cc = (float)(uint)(byte)((bVar9 & 1) + ((byte)local_c8 & 1) + 2);
      __position._M_current =
           (this_00->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this_00->counts,__position,
                   (uint *)&local_cc);
        if (local_cc == 0.0) {
          return;
        }
      }
      else {
        *__position._M_current = (uint)local_cc;
        ppuVar1 = &(this_00->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar13 = 0;
      do {
        local_8c = (int)((ulong)((long)(this_00->positions).
                                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->positions).
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555
        ;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&this_00->indices,&local_8c);
        __position_00._M_current =
             (this_00->positions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this_00->positions).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this_00,
                     __position_00,__args);
        }
        else {
          (__position_00._M_current)->z = __args->z;
          fVar7 = __args->y;
          (__position_00._M_current)->x = __args->x;
          (__position_00._M_current)->y = fVar7;
          ppaVar2 = &(this_00->positions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar2 = *ppaVar2 + 1;
        }
        aVar8 = local_48;
        __position_01._M_current =
             (this_00->colors).
             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_01._M_current ==
            (this_00->colors).
            super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
          _M_realloc_insert<aiColor4t<float>const&>
                    ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&this_00->colors,
                     __position_01,&local_48);
        }
        else {
          (__position_01._M_current)->r = local_48.r;
          (__position_01._M_current)->g = local_48.g;
          (__position_01._M_current)->b = local_48.b;
          (__position_01._M_current)->a = local_48.a;
          ppaVar3 = &(this_00->colors).
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar3 = *ppaVar3 + 1;
          local_48 = aVar8;
        }
        uVar13 = uVar13 + 1;
        __args = __args + 1;
      } while (uVar13 < (uint)local_cc);
      return;
    }
  }
LAB_00437d10:
  this_02 = DefaultLogger::get();
  Logger::warn(this_02,"DXF: unexpected vertex setup in 3DFACE/LINE/FACE entity; ignoring");
  pBVar5 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  psVar6 = pBVar5[-1].lines.
           super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar5[-1].lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar6 + -1;
  this_01 = psVar6[-1].super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void DXFImporter::Parse3DFace(DXF::LineReader& reader, DXF::FileData& output)
{
    // (note) this is also used for for parsing line entities, so we
    // must handle the vertex_count == 2 case as well.

    output.blocks.back().lines.push_back( std::shared_ptr<DXF::PolyLine>( new DXF::PolyLine() )  );
    DXF::PolyLine& line = *output.blocks.back().lines.back();

    aiVector3D vip[4];
    aiColor4D  clr = AI_DXF_DEFAULT_COLOR;

    bool b[4] = {false,false,false,false};
    while( !reader.End() ) {

        // next entity with a groupcode == 0 is probably already the next vertex or polymesh entity
        if (reader.GroupCode() == 0) {
            break;
        }
        switch (reader.GroupCode())
        {

        // 8 specifies the layer
        case 8:
            line.layer = reader.Value();
            break;

        // x position of the first corner
        case 10:
            vip[0].x = reader.ValueAsFloat();
            b[2] = true;
            break;

        // y position of the first corner
        case 20:
            vip[0].y = reader.ValueAsFloat();
            b[2] = true;
            break;

        // z position of the first corner
        case 30:
            vip[0].z = reader.ValueAsFloat();
            b[2] = true;
            break;

        // x position of the second corner
        case 11:
            vip[1].x = reader.ValueAsFloat();
            b[3] = true;
            break;

        // y position of the second corner
        case 21:
            vip[1].y = reader.ValueAsFloat();
            b[3] = true;
            break;

        // z position of the second corner
        case 31:
            vip[1].z = reader.ValueAsFloat();
            b[3] = true;
            break;

        // x position of the third corner
        case 12:
            vip[2].x = reader.ValueAsFloat();
            b[0] = true;
            break;

        // y position of the third corner
        case 22:
            vip[2].y = reader.ValueAsFloat();
            b[0] = true;
            break;

        // z position of the third corner
        case 32:
            vip[2].z = reader.ValueAsFloat();
            b[0] = true;
            break;

        // x position of the fourth corner
        case 13:
            vip[3].x = reader.ValueAsFloat();
            b[1] = true;
            break;

        // y position of the fourth corner
        case 23:
            vip[3].y = reader.ValueAsFloat();
            b[1] = true;
            break;

        // z position of the fourth corner
        case 33:
            vip[3].z = reader.ValueAsFloat();
            b[1] = true;
            break;

        // color
        case 62:
            clr = g_aclrDxfIndexColors[reader.ValueAsUnsignedInt() % AI_DXF_NUM_INDEX_COLORS];
            break;
        };

        ++reader;
    }

    // the fourth corner may even be identical to the third,
    // in this case we treat it as if it didn't exist.
    if (vip[3] == vip[2]) {
        b[1] = false;
    }

    // sanity checks to see if we got something meaningful
    if ((b[1] && !b[0]) || !b[2] || !b[3]) {
        ASSIMP_LOG_WARN("DXF: unexpected vertex setup in 3DFACE/LINE/FACE entity; ignoring");
        output.blocks.back().lines.pop_back();
        return;
    }

    const unsigned int cnt = (2+(b[0]?1:0)+(b[1]?1:0));
    line.counts.push_back(cnt);

    for (unsigned int i = 0; i < cnt; ++i) {
        line.indices.push_back(static_cast<unsigned int>(line.positions.size()));
        line.positions.push_back(vip[i]);
        line.colors.push_back(clr);
    }
}